

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestStreaming::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::TestStreaming::FinishStreamParams,_capnproto_test::capnp::test::TestStreaming::FinishStreamResults>
  CVar1;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined6 in_register_00000032;
  Server *pSVar3;
  DispatchCallResult DVar4;
  anon_class_16_2_06e2585c local_48;
  anon_class_16_2_06e2585c local_38;
  short local_22;
  Server *pSStack_20;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar2;
  
  pSVar3 = (Server *)CONCAT62(in_register_00000032,methodId);
  local_22 = (short)context.hook;
  pSStack_20 = pSVar3;
  context_local.hook = (CallContextHook *)this;
  if (local_22 == 0) {
    local_38.context = (CallContext<capnp::AnyPointer,_capnp::AnyPointer> *)&this_local;
    local_38.this = pSVar3;
    kj::
    evalNow<capnproto_test::capnp::test::TestStreaming::Server::dispatchCallInternal(unsigned_short,capnp::CallContext<capnp::AnyPointer,capnp::AnyPointer>)::__0>
              ((kj *)this,&local_38);
    this->field_0x8 = 1;
    this->field_0x9 = 1;
    uVar2 = extraout_RDX;
  }
  else if (local_22 == 1) {
    local_48.context = (CallContext<capnp::AnyPointer,_capnp::AnyPointer> *)&this_local;
    local_48.this = pSVar3;
    kj::
    evalNow<capnproto_test::capnp::test::TestStreaming::Server::dispatchCallInternal(unsigned_short,capnp::CallContext<capnp::AnyPointer,capnp::AnyPointer>)::__1>
              ((kj *)this,&local_48);
    this->field_0x8 = 1;
    this->field_0x9 = 1;
    uVar2 = extraout_RDX_00;
  }
  else if (local_22 == 2) {
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestStreaming::FinishStreamParams,capnproto_test::capnp::test::TestStreaming::FinishStreamResults>
                      ((Server *)((long)&pSVar3->_vptr_Server + (long)pSVar3->_vptr_Server[-3]),
                       in_RCX);
    (*pSVar3->_vptr_Server[3])(this,pSVar3,CVar1.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 1;
    uVar2 = extraout_RDX_01;
  }
  else {
    DVar4 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)&pSVar3->_vptr_Server + (long)pSVar3->_vptr_Server[-3]),
                       0x491cc5,0xedbe);
    uVar2 = DVar4._8_8_;
  }
  DVar4.isStreaming = (bool)(char)uVar2;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestStreaming::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        kj::evalNow([&]() {
          return doStreamI(::capnp::Capability::Server::internalGetTypedStreamingContext<
               ::capnproto_test::capnp::test::TestStreaming::DoStreamIParams>(context));
        }),
        true,
        true
      };
    case 1:
      return {
        kj::evalNow([&]() {
          return doStreamJ(::capnp::Capability::Server::internalGetTypedStreamingContext<
               ::capnproto_test::capnp::test::TestStreaming::DoStreamJParams>(context));
        }),
        true,
        true
      };
    case 2:
      return {
        finishStream(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestStreaming::FinishStreamParams,  ::capnproto_test::capnp::test::TestStreaming::FinishStreamResults>(context)),
        false,
        true
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestStreaming",
          0xd9d44ddacab3edbeull, methodId);
  }
}